

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

Status __thiscall
google::protobuf::(anonymous_namespace)::
Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
          (_anonymous_namespace_ *this,char *args,Edition args_1,char *args_2,Edition args_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  uintptr_t extraout_RAX_01;
  Status SVar3;
  AlphaNum *in_R9;
  string_view message;
  StringifySink local_148;
  StringifySink local_128;
  string local_108;
  AlphaNum local_e8;
  AlphaNum local_b8;
  size_t local_88;
  char *local_80;
  AlphaNum local_58;
  
  if (args == (char *)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = strlen(args);
  }
  paVar1 = &local_128.buffer_.field_2;
  local_128.buffer_.field_2._M_allocated_capacity = 0;
  local_128.buffer_.field_2._8_8_ = 0;
  local_128.buffer_._M_string_length = 0;
  local_128.buffer_._M_dataplus._M_p = (pointer)paVar1;
  local_80 = args;
  AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_128,args_1);
  local_b8.piece_._M_len = local_128.buffer_._M_string_length;
  local_b8.piece_._M_str = local_128.buffer_._M_dataplus._M_p;
  if (args_2 == (char *)0x0) {
    local_e8.piece_._M_len = 0;
  }
  else {
    local_e8.piece_._M_len = strlen(args_2);
  }
  paVar2 = &local_148.buffer_.field_2;
  local_148.buffer_.field_2._M_allocated_capacity = 0;
  local_148.buffer_.field_2._8_8_ = 0;
  local_148.buffer_._M_string_length = 0;
  local_148.buffer_._M_dataplus._M_p = (pointer)paVar2;
  local_e8.piece_._M_str = args_2;
  AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_148,args_3);
  local_58.piece_._M_len = local_148.buffer_._M_string_length;
  local_58.piece_._M_str = local_148.buffer_._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_108,(lts_20250127 *)&local_88,&local_b8,&local_e8,&local_58,in_R9);
  message._M_str = (char *)local_108._M_string_length;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  SVar3.rep_ = (uintptr_t)&local_108.field_2;
  if (local_108._M_dataplus._M_p != (pointer)SVar3.rep_) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    SVar3.rep_ = (uintptr_t)extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.buffer_._M_dataplus._M_p != paVar2) {
    operator_delete(local_148.buffer_._M_dataplus._M_p,
                    local_148.buffer_.field_2._M_allocated_capacity + 1);
    SVar3.rep_ = (uintptr_t)extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.buffer_._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.buffer_._M_dataplus._M_p,
                    local_128.buffer_.field_2._M_allocated_capacity + 1);
    SVar3.rep_ = extraout_RAX_01;
  }
  return (Status)SVar3.rep_;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}